

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O1

void Curl_conncache_foreach(conncache *connc,void *param,_func_int_connectdata_ptr_void_ptr *func)

{
  void *pvVar1;
  connectdata *pcVar2;
  int iVar3;
  curl_hash_element *pcVar4;
  undefined8 *puVar5;
  curl_hash_iterator iter;
  curl_hash_iterator local_40;
  
  if (connc != (conncache *)0x0) {
    Curl_hash_start_iterate(connc->hash,&local_40);
    pcVar4 = Curl_hash_next_element(&local_40);
    if (pcVar4 != (curl_hash_element *)0x0) {
      do {
        pvVar1 = pcVar4->ptr;
        pcVar4 = Curl_hash_next_element(&local_40);
        puVar5 = (undefined8 *)**(undefined8 **)((long)pvVar1 + 0x10);
        while (puVar5 != (undefined8 *)0x0) {
          pcVar2 = (connectdata *)*puVar5;
          puVar5 = (undefined8 *)puVar5[2];
          iVar3 = (*func)(pcVar2,param);
          if (iVar3 == 1) {
            return;
          }
        }
      } while (pcVar4 != (curl_hash_element *)0x0);
    }
  }
  return;
}

Assistant:

void Curl_conncache_foreach(struct conncache *connc,
                            void *param,
                            int (*func)(struct connectdata *conn, void *param))
{
  struct curl_hash_iterator iter;
  struct curl_llist_element *curr;
  struct curl_hash_element *he;

  if(!connc)
    return;

  Curl_hash_start_iterate(connc->hash, &iter);

  he = Curl_hash_next_element(&iter);
  while(he) {
    struct connectbundle *bundle;
    struct connectdata *conn;

    bundle = he->ptr;
    he = Curl_hash_next_element(&iter);

    curr = bundle->conn_list->head;
    while(curr) {
      /* Yes, we need to update curr before calling func(), because func()
         might decide to remove the connection */
      conn = curr->ptr;
      curr = curr->next;

      if(1 == func(conn, param))
        return;
    }
  }
}